

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.c
# Opt level: O0

void sha256_hash_file_contents(char *fpath,Hash *hash)

{
  BYTE *data;
  char *contents;
  size_t len;
  SHA256_CTX shactx;
  Hash *hash_local;
  char *fpath_local;
  
  shactx.state._24_8_ = hash;
  sha256_init((SHA256_CTX *)&len);
  contents = (char *)0x0;
  data = (BYTE *)fread_all_into_cstr(fpath,(size_t *)&contents);
  if (data != (BYTE *)0x0) {
    sha256_update((SHA256_CTX *)&len,data,(size_t)contents);
    sha256_finalize_to_cstr((SHA256_CTX *)&len,(Hash *)shactx.state._24_8_);
    free(data);
    return;
  }
  log_log(0x80,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/hashing.c"
          ,0x51,"%s: Failed to hash (sha256) file contents\n",fpath);
  abort();
}

Assistant:

void sha256_hash_file_contents(const char *fpath, Hash *hash) {

    SHA256_CTX shactx;
    sha256_init(&shactx);
    size_t len = 0;
    char *contents = fread_all_into_cstr(fpath, &len);
    if (contents) {
        sha256_update(&shactx, (const BYTE *)contents, len);
    } else {
        log_fatal("%s: Failed to hash (sha256) file contents\n", fpath);
        abort();
    }
    sha256_finalize_to_cstr(&shactx, hash);
    free(contents);
}